

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O1

void __thiscall fmt::File::File(File *this,CStringRef path,int oflag)

{
  int iVar1;
  int *piVar2;
  SystemError *this_00;
  BasicCStringRef<char> local_20;
  
  local_20.data_ = path.data_;
  do {
    iVar1 = open(local_20.data_,oflag,0x180);
    this->fd_ = iVar1;
    if (iVar1 != -1) {
      return;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  this_00 = (SystemError *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  SystemError::SystemError<fmt::BasicCStringRef<char>>
            (this_00,*piVar2,(CStringRef)0x146fab,&local_20);
  __cxa_throw(this_00,&SystemError::typeinfo,SystemError::~SystemError);
}

Assistant:

fmt::File::File(fmt::CStringRef path, int oflag) {
  int mode = S_IRUSR | S_IWUSR;
#if defined(_WIN32) && !defined(__MINGW32__)
  fd_ = -1;
  FMT_POSIX_CALL(sopen_s(&fd_, path.c_str(), oflag, _SH_DENYNO, mode));
#else
  FMT_RETRY(fd_, FMT_POSIX_CALL(open(path.c_str(), oflag, mode)));
#endif
  if (fd_ == -1)
    FMT_THROW(SystemError(errno, "cannot open file {}", path));
}